

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_16_toc_pd(void)

{
  uint uVar1;
  uint addr_in;
  
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar1 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  m68ki_cpu.x_flag = uVar1 << 4 & 0x100;
  m68ki_cpu.n_flag = uVar1 << 4 & 0x80;
  m68ki_cpu.not_z_flag = (uint)((uVar1 & 4) == 0);
  m68ki_cpu.v_flag = (uVar1 & 2) << 6;
  m68ki_cpu.c_flag = (uVar1 & 1) << 8;
  return;
}

Assistant:

static void m68k_op_addi_8_pi7(void)
{
	uint src = OPER_I_8();
	uint ea = EA_A7_PI_8();
	uint dst = m68ki_read_8(ea);
	uint res = src + dst;

	FLAG_N = NFLAG_8(res);
	FLAG_V = VFLAG_ADD_8(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);

	m68ki_write_8(ea, FLAG_Z);
}